

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

Uint64 __thiscall
Diligent::RenderDeviceVkImpl::ExecuteCommandBuffer
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkSubmitInfo *SubmitInfo,
          vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *pSignalFences)

{
  Uint64 SubmittedCmdBuffNumber;
  Uint64 SubmittedFenceValue;
  Uint64 local_28;
  Uint64 local_20;
  
  local_20 = 0;
  local_28 = 0;
  SubmitCommandBuffer(this,CommandQueueId,SubmitInfo,&local_28,&local_20,pSignalFences);
  VulkanUtilities::VulkanMemoryManager::ShrinkMemory(&this->m_MemoryMgr);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::PurgeReleaseQueue(&this->
                       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      ,CommandQueueId,false);
  return local_20;
}

Assistant:

Uint64 RenderDeviceVkImpl::ExecuteCommandBuffer(SoftwareQueueIndex CommandQueueId, const VkSubmitInfo& SubmitInfo, std::vector<std::pair<Uint64, RefCntAutoPtr<FenceVkImpl>>>* pSignalFences)
{
    Uint64 SubmittedFenceValue    = 0;
    Uint64 SubmittedCmdBuffNumber = 0;
    SubmitCommandBuffer(CommandQueueId, SubmitInfo, SubmittedCmdBuffNumber, SubmittedFenceValue, pSignalFences);

    m_MemoryMgr.ShrinkMemory();
    PurgeReleaseQueue(CommandQueueId);

    return SubmittedFenceValue;
}